

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (CompilerMSL *this,string *expr_str,SPIRType *type,uint32_t physical_type_id,bool packed,
          bool row_major)

{
  char *pcVar1;
  bool bVar2;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000081;
  byte in_stack_00000008;
  uint32_t local_1ac;
  byte local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  spirv_cross local_120 [32];
  spirv_cross local_100 [36];
  uint local_dc;
  char *pcStack_d8;
  uint32_t i;
  char *load_swiz;
  char *local_c8;
  char *base_type;
  uint local_b8;
  uint32_t physical_vecsize;
  uint32_t columns;
  uint32_t vecsize;
  undefined1 local_90 [56];
  string local_58 [32];
  SPIRType *local_38;
  SPIRType *physical_type;
  bool row_major_local;
  bool packed_local;
  SPIRType *pSStack_28;
  uint32_t physical_type_id_local;
  SPIRType *type_local;
  string *expr_str_local;
  CompilerMSL *this_local;
  string *unpack_expr;
  
  pSStack_28 = (SPIRType *)CONCAT44(in_register_0000000c,physical_type_id);
  physical_type._4_4_ = (uint32_t)CONCAT71(in_register_00000081,packed);
  physical_type._2_1_ = in_stack_00000008 & 1;
  physical_type._3_1_ = row_major;
  type_local = type;
  expr_str_local = expr_str;
  this_local = this;
  if ((physical_type._4_4_ != 0) || (row_major)) {
    local_38 = (SPIRType *)0x0;
    if (physical_type._4_4_ != 0) {
      local_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)expr_str,physical_type._4_4_);
    }
    local_90[0x36] = 0;
    local_90[0x23] = 0;
    local_171 = 0;
    if (local_38 != (SPIRType *)0x0) {
      bVar2 = Compiler::is_vector((Compiler *)expr_str,local_38);
      local_171 = 0;
      if (bVar2) {
        bVar2 = Compiler::is_array((Compiler *)expr_str,local_38);
        local_171 = 0;
        if ((bVar2) && (local_171 = 0, pSStack_28->vecsize < local_38->vecsize)) {
          pcVar1 = unpack_expression_type::swizzle_lut[pSStack_28->vecsize - 1];
          ::std::allocator<char>::allocator();
          local_90[0x36] = 1;
          ::std::__cxx11::string::string(local_58,pcVar1,(allocator *)(local_90 + 0x37));
          local_90[0x23] = 1;
          bVar2 = expression_ends_with((string *)type,(string *)local_58);
          local_171 = bVar2 ^ 0xff;
        }
      }
    }
    if ((local_90[0x23] & 1) != 0) {
      ::std::__cxx11::string::~string(local_58);
    }
    if ((local_90[0x36] & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)(local_90 + 0x37));
    }
    if ((local_171 & 1) == 0) {
      if ((((local_38 == (SPIRType *)0x0) ||
           (bVar2 = Compiler::is_matrix((Compiler *)expr_str,local_38), !bVar2)) ||
          (bVar2 = Compiler::is_vector((Compiler *)expr_str,pSStack_28), !bVar2)) ||
         (local_38->vecsize <= pSStack_28->vecsize)) {
        bVar2 = Compiler::is_matrix((Compiler *)expr_str,pSStack_28);
        if (bVar2) {
          if (local_38 == (SPIRType *)0x0) {
            local_38 = pSStack_28;
          }
          physical_vecsize = pSStack_28->vecsize;
          local_b8 = pSStack_28->columns;
          if ((physical_type._2_1_ & 1) != 0) {
            ::std::swap<unsigned_int>(&physical_vecsize,&local_b8);
          }
          if ((physical_type._2_1_ & 1) == 0) {
            local_1ac = local_38->vecsize;
          }
          else {
            local_1ac = local_38->columns;
          }
          base_type._4_4_ = local_1ac;
          local_c8 = "float";
          if (pSStack_28->width == 0x10) {
            local_c8 = "half";
          }
          load_swiz._7_1_ = 0;
          join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((spirv_cross *)this,&local_c8,&local_b8,(char (*) [2])0x4df009,
                     &physical_vecsize,(char (*) [2])0x4f3f9c);
          pcStack_d8 = "";
          if (base_type._4_4_ != physical_vecsize) {
            pcStack_d8 = unpack_expression_type::swizzle_lut[physical_vecsize - 1];
          }
          for (local_dc = 0; local_dc < local_b8; local_dc = local_dc + 1) {
            if (local_dc != 0) {
              ::std::__cxx11::string::operator+=((string *)this,", ");
            }
            if ((physical_type._3_1_ & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&>
                        (local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
                         (char (*) [2])0x4f1699,&local_dc,(char (*) [2])0x4e3676,
                         &stack0xffffffffffffff28);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_120);
              ::std::__cxx11::string::~string((string *)local_120);
            }
            else {
              join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                        (local_100,&local_c8,(uint *)((long)&base_type + 4),(char (*) [2])0x4f3f9c,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
                         (char (*) [2])0x4f1699,&local_dc,(char (*) [2])0x4e3676,
                         (char (*) [2])0x4dff7a,&stack0xffffffffffffff28);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_100);
              ::std::__cxx11::string::~string((string *)local_100);
            }
          }
          ::std::__cxx11::string::operator+=((string *)this,")");
        }
        else {
          (**(code **)(*(long *)expr_str + 0x98))(local_140,expr_str,pSStack_28,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    ((spirv_cross *)this,local_140,(char (*) [2])0x4f3f9c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
                     (char (*) [2])0x4dff7a);
          ::std::__cxx11::string::~string((string *)local_140);
        }
      }
      else {
        bVar2 = false;
        if (pSStack_28->vecsize != 0) {
          bVar2 = pSStack_28->vecsize < 4;
        }
        if (!bVar2) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0xf00,
                        "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                       );
        }
        CompilerGLSL::enclose_expression((CompilerGLSL *)&columns,expr_str);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)&columns);
        ::std::__cxx11::string::~string((string *)&columns);
      }
    }
    else {
      bVar2 = false;
      if (pSStack_28->vecsize != 0) {
        bVar2 = pSStack_28->vecsize < 4;
      }
      if (!bVar2) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0xefa,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression((CompilerGLSL *)local_90,expr_str);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_90);
      ::std::__cxx11::string::~string((string *)local_90);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)this,(string *)type);
  }
  return this;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
	};

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) && physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}